

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

QVariant * __thiscall
QFileSystemModel::myComputer(QVariant *__return_storage_ptr__,QFileSystemModel *this,int role)

{
  QAbstractFileIconProvider *pQVar1;
  long in_FS_OFFSET;
  QIcon local_30 [3];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (role == 1) {
    pQVar1 = QFileInfoGatherer::iconProvider
                       (*(QFileInfoGatherer **)(*(long *)&this->field_0x8 + 0xe0));
    if (pQVar1 != (QAbstractFileIconProvider *)0x0) {
      (*pQVar1->_vptr_QAbstractFileIconProvider[2])(local_30,pQVar1,0);
      QIcon::operator_cast_to_QVariant(__return_storage_ptr__,local_30);
      QIcon::~QIcon(local_30);
      goto LAB_00611fa9;
    }
  }
  else if (role == 0) {
    QMetaObject::tr((char *)local_30,(char *)&staticMetaObject,0x6c739f);
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_30);
    if (local_30[0].d != (QIconPrivate *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_30[0].d)->engine)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_30[0].d)->engine)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_30[0].d)->engine)->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_30[0].d,2,0x10);
      }
    }
    goto LAB_00611fa9;
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_00611fa9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QFileSystemModel::myComputer(int role) const
{
#if QT_CONFIG(filesystemwatcher)
    Q_D(const QFileSystemModel);
#endif
    switch (role) {
    case Qt::DisplayRole:
        return QFileSystemModelPrivate::myComputer();
#if QT_CONFIG(filesystemwatcher)
    case Qt::DecorationRole:
        if (auto *provider = d->fileInfoGatherer->iconProvider())
            return provider->icon(QAbstractFileIconProvider::Computer);
    break;
#endif
    }
    return QVariant();
}